

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

stbtt_uint32 stbtt__cff_int(stbtt__buf *b)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  stbtt__buf *in_RDI;
  int b0;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  bVar1 = stbtt__buf_get8(in_RDI);
  uVar2 = (uint)bVar1;
  if ((uVar2 < 0x20) || (0xf6 < uVar2)) {
    if ((uVar2 < 0xf7) || (0xfa < uVar2)) {
      if ((uVar2 < 0xfb) || (0xfe < uVar2)) {
        if (uVar2 == 0x1c) {
          local_4 = stbtt__buf_get((stbtt__buf *)
                                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                   in_stack_ffffffffffffffdc);
        }
        else if (uVar2 == 0x1d) {
          local_4 = stbtt__buf_get((stbtt__buf *)
                                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                   in_stack_ffffffffffffffdc);
        }
        else {
          local_4 = 0;
        }
      }
      else {
        iVar3 = (uVar2 - 0xfb) * -0x100;
        bVar1 = stbtt__buf_get8(in_RDI);
        local_4 = (iVar3 - (uint)bVar1) - 0x6c;
      }
    }
    else {
      bVar1 = stbtt__buf_get8(in_RDI);
      local_4 = (uVar2 - 0xf7) * 0x100 + (uint)bVar1 + 0x6c;
    }
  }
  else {
    local_4 = uVar2 - 0x8b;
  }
  return local_4;
}

Assistant:

static stbtt_uint32 stbtt__cff_int(stbtt__buf *b)
{
int b0 = stbtt__buf_get8(b);
if (b0 >= 32 && b0 <= 246)       return b0 - 139;
else if (b0 >= 247 && b0 <= 250) return (b0 - 247)*256 + stbtt__buf_get8(b) + 108;
else if (b0 >= 251 && b0 <= 254) return -(b0 - 251)*256 - stbtt__buf_get8(b) - 108;
else if (b0 == 28)               return stbtt__buf_get16(b);
else if (b0 == 29)               return stbtt__buf_get32(b);
STBTT_assert(0);
return 0;
}